

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O0

Error asmjit::v1_14::x86::InstInternal::rwHandleAVX512
                (BaseInst *inst,CommonInfo *commonInfo,InstRWInfo *out)

{
  bool bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  
  if (((*(int *)(in_RDI + 8) != 0) && (((byte)(*(uint *)(in_RDI + 8) >> 3) & 0x1f) == 0x11)) &&
     (*(char *)(in_RDX + 0xc) != '\0')) {
    *(uint *)(in_RDX + 0x20) = *(uint *)(in_RDX + 0x20) | 1;
    *(undefined8 *)(in_RDX + 0x28) = 0xff;
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (*(InstOptions *)(in_RDI + 4),kX86_ZMask);
    if ((!bVar1) &&
       (bVar1 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                          (*(uint *)(in_RSI + 4) & 0x7ff,kImplicitZ), !bVar1)) {
      *(uint *)(in_RDX + 0x40) = *(uint *)(in_RDX + 0x40) | 1;
      *(ulong *)(in_RDX + 0x48) = *(ulong *)(in_RDX + 0x50) | *(ulong *)(in_RDX + 0x48);
    }
  }
  return 0;
}

Assistant:

static ASMJIT_FORCE_INLINE Error rwHandleAVX512(const BaseInst& inst, const InstDB::CommonInfo& commonInfo, InstRWInfo* out) noexcept {
  if (inst.hasExtraReg() && inst.extraReg().type() == RegType::kX86_KReg && out->opCount() > 0) {
    // AVX-512 instruction that uses a destination with {k} register (zeroing vs masking).
    out->_extraReg.addOpFlags(OpRWFlags::kRead);
    out->_extraReg.setReadByteMask(0xFF);
    if (!inst.hasOption(InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Flag(InstDB::Avx512Flags::kImplicitZ)) {
      out->_operands[0].addOpFlags(OpRWFlags::kRead);
      out->_operands[0]._readByteMask |= out->_operands[0]._writeByteMask;
    }
  }

  return kErrorOk;
}